

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_31::WebSocketPipeImpl::Aborted::pumpTo(Aborted *this,WebSocket *other)

{
  char (*in_RCX) [41];
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  String local_190;
  Exception local_178;
  WebSocket *other_local;
  Aborted *this_local;
  
  other_local = other;
  this_local = this;
  _::Debug::makeDescription<char_const(&)[41]>
            (&local_190,(Debug *)"\"other end of WebSocketPipe was destroyed\"",
             "other end of WebSocketPipe was destroyed",in_RCX);
  Exception::Exception
            (&local_178,DISCONNECTED,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
             ,0xbf3,&local_190);
  Promise<void>::Promise((Promise<void> *)this,&local_178);
  Exception::~Exception(&local_178);
  String::~String(&local_190);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> pumpTo(WebSocket& other) override {
      return KJ_EXCEPTION(DISCONNECTED, "other end of WebSocketPipe was destroyed");
    }